

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O3

int __thiscall Nes_Dmc::count_reads(Nes_Dmc *this,nes_time_t time,nes_time_t *last_read)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (last_read != (nes_time_t *)0x0) {
    *last_read = time;
  }
  iVar1 = (this->super_Nes_Osc).length_counter;
  iVar2 = 0;
  if (iVar1 != 0) {
    iVar5 = (this->bits_remain + -1) * this->period +
            (this->super_Nes_Osc).delay + this->apu->last_dmc_time;
    if (time - iVar5 != 0 && iVar5 <= time) {
      iVar4 = this->period * 8;
      iVar2 = ((time - iVar5) + -1) / iVar4;
      iVar3 = iVar2 + 1;
      if (iVar2 < iVar1) {
        iVar1 = iVar3;
      }
      iVar2 = iVar1;
      if (((this->super_Nes_Osc).regs[0] & 0x40) != 0) {
        iVar2 = iVar3;
      }
      if (last_read != (nes_time_t *)0x0) {
        *last_read = (iVar2 + -1) * iVar4 + iVar5 + 1;
      }
    }
  }
  return iVar2;
}

Assistant:

int Nes_Dmc::count_reads( nes_time_t time, nes_time_t* last_read ) const
{
	if ( last_read )
		*last_read = time;
	
	if ( length_counter == 0 )
		return 0; // not reading
	
	nes_time_t first_read = next_read_time();
	nes_time_t avail = time - first_read;
	if ( avail <= 0 )
		return 0;
	
	int count = (avail - 1) / (period * 8) + 1;
	if ( !(regs [0] & loop_flag) && count > length_counter )
		count = length_counter;
	
	if ( last_read )
	{
		*last_read = first_read + (count - 1) * (period * 8) + 1;
		check( *last_read <= time );
		check( count == count_reads( *last_read, NULL ) );
		check( count - 1 == count_reads( *last_read - 1, NULL ) );
	}
	
	return count;
}